

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O1

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_node_base *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CommentInfo **ppCVar2;
  _Base_ptr *pp_Var3;
  pointer *pppcVar4;
  _Rb_tree_header *p_Var5;
  cmMakefile *pcVar6;
  pointer pcVar7;
  cmSourceFile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *psVar9;
  size_type sVar10;
  pointer ppcVar11;
  undefined1 uVar12;
  pointer pbVar13;
  bool bVar14;
  bool bVar15;
  TargetType targetType;
  int iVar16;
  cmLocalGenerator *pcVar17;
  char *pcVar18;
  string *psVar19;
  Value *pVVar20;
  cmInstallTargetGenerator *this_00;
  OutputInfo *pOVar21;
  mapped_type *pmVar22;
  _Base_ptr p_Var23;
  pointer ppcVar24;
  long *plVar25;
  mapped_type *this_01;
  long *plVar26;
  size_type *psVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  string *value;
  pointer ppcVar28;
  string *psVar29;
  string *i;
  _Alloc_hider _Var30;
  pointer dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  undefined8 uVar31;
  const_iterator cVar32;
  const_iterator cVar33;
  string dest;
  __node_base_ptr p_Stack_660;
  string installPath;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> targetGenerators;
  Value installPaths;
  _Alloc_hider local_5d8;
  cmOutputConverter *local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  vStack_5a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  string COMPILE_OPTIONS;
  string linkPath;
  string COMPILE_DEFINITIONS;
  string installPrefix;
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  pointer local_440;
  ValueHolder local_438 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  string INCLUDE_DIRECTORIES;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string defPropName;
  Value ttl;
  string local_378;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string local_340;
  string typeName;
  Value sourceGroupsValue;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  pcVar17 = cmGeneratorTarget::GetLocalGenerator(target);
  targetType = cmGeneratorTarget::GetType(target);
  local_440 = (pointer)CONCAT44(local_440._4_4_,targetType);
  pcVar18 = cmState::GetTargetTypeName(targetType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeName,pcVar18,(allocator<char> *)&installPaths);
  Json::Value::Value(&ttl,arrayValue);
  Json::Value::Value(&installPaths,"EXECUTABLE");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"STATIC_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"SHARED_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"MODULE_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"OBJECT_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"UTILITY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"INTERFACE_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  bVar14 = Json::Value::isNull(&ttl);
  if (bVar14) {
    bVar15 = false;
  }
  else {
    cVar32 = Json::Value::begin(&ttl);
    cVar33 = Json::Value::end(&ttl);
    targetGenerators.super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&targetGenerators.
                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&targetGenerators,typeName._M_dataplus._M_p,
               typeName._M_dataplus._M_p + typeName._M_string_length);
    languageDataMap._M_t._M_impl._0_8_ =
         &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&languageDataMap,
               targetGenerators.
               super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (long)targetGenerators.
                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
               (long)targetGenerators.
                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    COMPILE_DEFINITIONS._M_string_length =
         CONCAT71(COMPILE_DEFINITIONS._M_string_length._1_7_,cVar33.super_ValueIteratorBase.isNull_)
    ;
    languages._M_t._M_impl._0_8_ = &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    COMPILE_DEFINITIONS._M_dataplus._M_p =
         (pointer)cVar33.super_ValueIteratorBase.current_._M_node._M_node;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&languages,languageDataMap._M_t._M_impl._0_8_,
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               languageDataMap._M_t._M_impl._0_8_);
    installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&installPath,languages._M_t._M_impl._0_8_,
               languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               languages._M_t._M_impl._0_8_);
    ppCVar2 = &installPaths.comments_;
    installPaths.value_ = (ValueHolder)ppCVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&installPaths,installPath._M_dataplus._M_p,
               installPath._M_dataplus._M_p + installPath._M_string_length);
    dest._M_dataplus._M_p = (pointer)&dest.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dest,installPaths.value_.int_,
               installPaths.value_.string_ + installPaths._8_8_);
    if (installPaths.value_ != ppCVar2) {
      operator_delete(installPaths.value_.string_,
                      (ulong)((long)&(installPaths.comments_)->comment_ + 1));
    }
    installPrefix._M_dataplus._M_p = (pointer)&installPrefix.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&installPrefix,dest._M_dataplus._M_p,
               dest._M_dataplus._M_p + dest._M_string_length);
    COMPILE_OPTIONS._M_string_length =
         CONCAT71(COMPILE_OPTIONS._M_string_length._1_7_,cVar32.super_ValueIteratorBase.isNull_);
    INCLUDE_DIRECTORIES._M_string_length =
         CONCAT71(INCLUDE_DIRECTORIES._M_string_length._1_7_,cVar33.super_ValueIteratorBase.isNull_)
    ;
    COMPILE_OPTIONS._M_dataplus._M_p =
         (pointer)cVar32.super_ValueIteratorBase.current_._M_node._M_node;
    INCLUDE_DIRECTORIES._M_dataplus._M_p =
         (pointer)cVar33.super_ValueIteratorBase.current_._M_node._M_node;
    bVar15 = Json::ValueIteratorBase::isEqual
                       ((ValueIteratorBase *)&COMPILE_OPTIONS,(SelfType *)&INCLUDE_DIRECTORIES);
    if (!bVar15) {
      do {
        linkPath._M_dataplus = COMPILE_OPTIONS._M_dataplus;
        linkPath._M_string_length =
             CONCAT71(linkPath._M_string_length._1_7_,(undefined1)COMPILE_OPTIONS._M_string_length);
        pVVar20 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&linkPath);
        Json::Value::asString_abi_cxx11_((string *)&installPaths,pVVar20);
        if (installPaths._8_8_ == installPrefix._M_string_length) {
          if (installPaths._8_8_ == 0) {
            bVar15 = true;
          }
          else {
            iVar16 = bcmp(installPaths.value_.string_,installPrefix._M_dataplus._M_p,
                          installPaths._8_8_);
            bVar15 = iVar16 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if (installPaths.value_ != ppCVar2) {
          operator_delete(installPaths.value_.string_,
                          (ulong)((long)&(installPaths.comments_)->comment_ + 1));
        }
        if (bVar15) break;
        Json::ValueIteratorBase::increment((ValueIteratorBase *)&COMPILE_OPTIONS);
        bVar15 = Json::ValueIteratorBase::isEqual
                           ((ValueIteratorBase *)&COMPILE_OPTIONS,(SelfType *)&INCLUDE_DIRECTORIES);
      } while (!bVar15);
    }
    _Var30._M_p = COMPILE_OPTIONS._M_dataplus._M_p;
    uVar12 = (undefined1)COMPILE_OPTIONS._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installPrefix._M_dataplus._M_p != &installPrefix.field_2) {
      operator_delete(installPrefix._M_dataplus._M_p,installPrefix.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dest._M_dataplus._M_p != &dest.field_2) {
      operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installPath._M_dataplus._M_p != &installPath.field_2) {
      operator_delete(installPath._M_dataplus._M_p,installPath.field_2._M_allocated_capacity + 1);
    }
    defPropName._M_dataplus = _Var30;
    defPropName._M_string_length = CONCAT71(defPropName._M_string_length._1_7_,uVar12);
    bVar15 = Json::ValueIteratorBase::isEqual
                       ((ValueIteratorBase *)&COMPILE_DEFINITIONS,(SelfType *)&defPropName);
    if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
        &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)languages._M_t._M_impl._0_8_,
                      (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ !=
        &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                      (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    bVar15 = !bVar15;
  }
  if ((!bVar14) &&
     (targetGenerators.
      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&targetGenerators.
                super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)) {
    operator_delete(targetGenerators.
                    super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(targetGenerators.
                             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             targetGenerators.
                             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if ((!bVar15) || (bVar14 = cmGeneratorTarget::IsImported(target), bVar14)) {
    Json::Value::Value(__return_storage_ptr__,nullValue);
  }
  else {
    Json::Value::Value(__return_storage_ptr__,objectValue);
    psVar19 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value(&local_58,psVar19);
    pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar20,&local_58);
    Json::Value::~Value(&local_58);
    bVar14 = cmTarget::GetIsGeneratorProvided(target->Target);
    Json::Value::Value(&local_80,bVar14);
    pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kIS_GENERATOR_PROVIDED_KEY_abi_cxx11_)
    ;
    Json::Value::operator=(pVVar20,&local_80);
    Json::Value::~Value(&local_80);
    Json::Value::Value(&local_a8,&typeName);
    pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar20,&local_a8);
    Json::Value::~Value(&local_a8);
    psVar19 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar17);
    Json::Value::Value(&local_d0,psVar19);
    pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar20,&local_d0);
    Json::Value::~Value(&local_d0);
    psVar19 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar17);
    Json::Value::Value(&local_f8,psVar19);
    pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar20,&local_f8);
    Json::Value::~Value(&local_f8);
    if ((int)local_440 != 7) {
      cmGeneratorTarget::GetFullName((string *)&installPaths,target,config,RuntimeBinaryArtifact);
      Json::Value::Value(&local_120,(string *)&installPaths);
      pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar20,&local_120);
      Json::Value::~Value(&local_120);
      if (installPaths.value_ != &installPaths.comments_) {
        operator_delete(installPaths.value_.string_,
                        (ulong)((long)&(installPaths.comments_)->comment_ + 1));
      }
      bVar14 = cmTarget::GetHaveInstallRule(target->Target);
      if (bVar14) {
        Json::Value::Value(&local_148,true);
        pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kHAS_INSTALL_RULE_abi_cxx11_);
        Json::Value::operator=(pVVar20,&local_148);
        Json::Value::~Value(&local_148);
        Json::Value::Value(&installPaths,arrayValue);
        std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
                  (&targetGenerators,&target->Makefile->InstallGenerators);
        ppcVar11 = targetGenerators.
                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pp_Var3 = &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          ppcVar28 = targetGenerators.
                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (*ppcVar28 == (cmInstallGenerator *)0x0) {
              this_00 = (cmInstallTargetGenerator *)0x0;
            }
            else {
              this_00 = (cmInstallTargetGenerator *)
                        __dynamic_cast(*ppcVar28,&cmInstallGenerator::typeinfo,
                                       &cmInstallTargetGenerator::typeinfo);
            }
            if ((this_00 != (cmInstallTargetGenerator *)0x0) &&
               (this_00->Target->Target == target->Target)) {
              cmInstallTargetGenerator::GetDestination(&dest,this_00,config);
              installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
              installPath._M_string_length = 0;
              installPath.field_2._M_allocated_capacity =
                   installPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
              if ((dest._M_string_length == 0) ||
                 (bVar14 = cmsys::SystemTools::FileIsFullPath(&dest), !bVar14)) {
                pcVar6 = target->Makefile;
                languages._M_t._M_impl._0_8_ = pp_Var3;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&languages,"CMAKE_INSTALL_PREFIX","");
                psVar19 = cmMakefile::GetSafeDefinition(pcVar6,(string *)&languages);
                installPrefix._M_dataplus._M_p = (pointer)&installPrefix.field_2;
                pcVar7 = (psVar19->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&installPrefix,pcVar7,pcVar7 + psVar19->_M_string_length);
                if ((_Base_ptr *)languages._M_t._M_impl._0_8_ != pp_Var3) {
                  operator_delete((void *)languages._M_t._M_impl._0_8_,
                                  (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
                languageDataMap._M_t._M_impl._0_8_ =
                     &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&languageDataMap,installPrefix._M_dataplus._M_p,
                           installPrefix._M_dataplus._M_p + installPrefix._M_string_length);
                std::__cxx11::string::_M_replace_aux
                          ((ulong)&languageDataMap,
                           languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,0,
                           '\x01');
                plVar25 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&languageDataMap,(ulong)dest._M_dataplus._M_p);
                plVar26 = plVar25 + 2;
                if ((long *)*plVar25 == plVar26) {
                  languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)*plVar26;
                  languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)plVar25[3];
                  languages._M_t._M_impl._0_8_ = pp_Var3;
                }
                else {
                  languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)*plVar26;
                  languages._M_t._M_impl._0_8_ = (long *)*plVar25;
                }
                languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar25[1];
                *plVar25 = (long)plVar26;
                plVar25[1] = 0;
                *(undefined1 *)(plVar25 + 2) = 0;
                std::__cxx11::string::operator=((string *)&installPath,(string *)&languages);
                if ((_Base_ptr *)languages._M_t._M_impl._0_8_ != pp_Var3) {
                  operator_delete((void *)languages._M_t._M_impl._0_8_,
                                  (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
                if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ !=
                    &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                                  (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header
                                                  ._M_header._M_parent)->_M_color + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)installPrefix._M_dataplus._M_p != &installPrefix.field_2) {
                  operator_delete(installPrefix._M_dataplus._M_p,
                                  installPrefix.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                std::__cxx11::string::_M_assign((string *)&installPath);
              }
              Json::Value::Value((Value *)&installPrefix,&installPath);
              Json::Value::append(&installPaths,(Value *)&installPrefix);
              Json::Value::~Value((Value *)&installPrefix);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)installPath._M_dataplus._M_p != &installPath.field_2) {
                operator_delete(installPath._M_dataplus._M_p,
                                installPath.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)dest._M_dataplus._M_p != &dest.field_2) {
                operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
              }
            }
            ppcVar28 = ppcVar28 + 1;
          } while (ppcVar28 != ppcVar11);
        }
        Json::Value::Value(&local_170,&installPaths);
        pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kINSTALL_PATHS_abi_cxx11_);
        Json::Value::operator=(pVVar20,&local_170);
        Json::Value::~Value(&local_170);
        if (targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(targetGenerators.
                          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT71(targetGenerators.
                                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   targetGenerators.
                                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                          (long)targetGenerators.
                                super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        Json::Value::~Value(&installPaths);
      }
      bVar14 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
      if (bVar14) {
        Json::Value::Value((Value *)&installPrefix,arrayValue);
        cmGeneratorTarget::GetFullPath(&dest,target,config,RuntimeBinaryArtifact,false);
        Json::Value::Value(&installPaths,&dest);
        Json::Value::append((Value *)&installPrefix,&installPaths);
        Json::Value::~Value(&installPaths);
        paVar1 = &dest.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        bVar14 = cmGeneratorTarget::IsDLLPlatform(target);
        if (bVar14) {
          cmGeneratorTarget::GetFullPath(&dest,target,config,ImportLibraryArtifact,false);
          Json::Value::Value(&installPaths,&dest);
          Json::Value::append((Value *)&installPrefix,&installPaths);
          Json::Value::~Value(&installPaths);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != paVar1) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          pOVar21 = cmGeneratorTarget::GetOutputInfo(target,config);
          if ((pOVar21 != (OutputInfo *)0x0) && ((pOVar21->PdbDir)._M_string_length != 0)) {
            std::operator+(&installPath,&pOVar21->PdbDir,'/');
            cmGeneratorTarget::GetPDBName((string *)&languages,target,config);
            std::operator+(&dest,&installPath,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &languages);
            Json::Value::Value(&installPaths,&dest);
            Json::Value::append((Value *)&installPrefix,&installPaths);
            Json::Value::~Value(&installPaths);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dest._M_dataplus._M_p != paVar1) {
              operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
                &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)languages._M_t._M_impl._0_8_,
                              (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header
                                             ._M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)installPath._M_dataplus._M_p != &installPath.field_2) {
              operator_delete(installPath._M_dataplus._M_p,
                              installPath.field_2._M_allocated_capacity + 1);
            }
          }
        }
        Json::Value::Value(&local_198,(Value *)&installPrefix);
        pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar20,&local_198);
        Json::Value::~Value(&local_198);
        cmGeneratorTarget::GetLinkerLanguage((string *)&installPaths,target,config);
        Json::Value::Value(&local_1c0,(string *)&installPaths);
        pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar20,&local_1c0);
        Json::Value::~Value(&local_1c0);
        if (installPaths.value_ != &installPaths.comments_) {
          operator_delete(installPaths.value_.string_,
                          (ulong)((long)&(installPaths.comments_)->comment_ + 1));
        }
        installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
        installPath._M_string_length = 0;
        installPath.field_2._M_allocated_capacity =
             installPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
        languages._M_t._M_impl._0_8_ =
             &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        pp_Var3 = &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        pppcVar4 = &targetGenerators.
                    super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        targetGenerators.
        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        targetGenerators.
        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        linkPath._M_string_length = 0;
        linkPath.field_2._M_local_buf[0] = '\0';
        targetGenerators.
        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pppcVar4;
        languageDataMap._M_t._M_impl._0_8_ = pp_Var3;
        linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&COMPILE_OPTIONS,pcVar17);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&dest,(cmStateSnapshot *)&COMPILE_OPTIONS)
        ;
        cmLinkLineComputer::cmLinkLineComputer
                  ((cmLinkLineComputer *)&installPaths,&pcVar17->super_cmOutputConverter,
                   (cmStateDirectory *)&dest);
        cmLocalGenerator::GetTargetFlags
                  (pcVar17,(cmLinkLineComputer *)&installPaths,config,&installPath,
                   (string *)&languageDataMap,(string *)&languages,(string *)&targetGenerators,
                   &linkPath,target);
        cmSystemTools::TrimWhitespace(&dest,&installPath);
        std::__cxx11::string::operator=((string *)&installPath,(string *)&dest);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::TrimWhitespace(&dest,(string *)&languages);
        std::__cxx11::string::operator=((string *)&languages,(string *)&dest);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::TrimWhitespace(&dest,(string *)&languageDataMap);
        std::__cxx11::string::operator=((string *)&languageDataMap,(string *)&dest);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::TrimWhitespace(&dest,(string *)&targetGenerators);
        std::__cxx11::string::operator=((string *)&targetGenerators,(string *)&dest);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::TrimWhitespace(&dest,&linkPath);
        std::__cxx11::string::operator=((string *)&linkPath,(string *)&dest);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::TrimWhitespace(&dest,&installPath);
        sVar10 = dest._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        if (sVar10 != 0) {
          Json::Value::Value(&local_1e8,&installPath);
          pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,&local_1e8);
          Json::Value::~Value(&local_1e8);
        }
        cmSystemTools::TrimWhitespace(&dest,(string *)&languages);
        sVar10 = dest._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        if (sVar10 != 0) {
          Json::Value::Value(&local_210,(string *)&languages);
          pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,&local_210);
          Json::Value::~Value(&local_210);
        }
        cmSystemTools::TrimWhitespace(&dest,(string *)&languageDataMap);
        sVar10 = dest._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        if (sVar10 != 0) {
          Json::Value::Value(&local_238,(string *)&languageDataMap);
          pVVar20 = Json::Value::operator[]
                              (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,&local_238);
          Json::Value::~Value(&local_238);
        }
        if (targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          Json::Value::Value(&local_260,(string *)&targetGenerators);
          pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,&local_260);
          Json::Value::~Value(&local_260);
        }
        if (linkPath._M_string_length != 0) {
          Json::Value::Value(&local_288,&linkPath);
          pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,&local_288);
          Json::Value::~Value(&local_288);
        }
        pcVar6 = pcVar17->Makefile;
        COMPILE_OPTIONS._M_dataplus._M_p = (pointer)&COMPILE_OPTIONS.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&COMPILE_OPTIONS,"CMAKE_SYSROOT","");
        psVar19 = cmMakefile::GetSafeDefinition(pcVar6,&COMPILE_OPTIONS);
        pcVar7 = (psVar19->_M_dataplus)._M_p;
        dest._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dest,pcVar7,pcVar7 + psVar19->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)COMPILE_OPTIONS._M_dataplus._M_p != &COMPILE_OPTIONS.field_2) {
          operator_delete(COMPILE_OPTIONS._M_dataplus._M_p,
                          CONCAT17(COMPILE_OPTIONS.field_2._M_local_buf[7],
                                   COMPILE_OPTIONS.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if (dest._M_string_length != 0) {
          Json::Value::Value(&local_2b0,&dest);
          pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,&local_2b0);
          Json::Value::~Value(&local_2b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dest._M_dataplus._M_p != paVar1) {
          operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
        }
        cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)&installPaths);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
          operator_delete(linkPath._M_dataplus._M_p,
                          CONCAT35(linkPath.field_2._M_allocated_capacity._5_3_,
                                   CONCAT41(linkPath.field_2._M_allocated_capacity._1_4_,
                                            linkPath.field_2._M_local_buf[0])) + 1);
        }
        if (targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar4) {
          operator_delete(targetGenerators.
                          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT71(targetGenerators.
                                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   targetGenerators.
                                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
        }
        if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ != pp_Var3) {
          operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                          (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
            &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)languages._M_t._M_impl._0_8_,
                          (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)installPath._M_dataplus._M_p != &installPath.field_2) {
          operator_delete(installPath._M_dataplus._M_p,installPath.field_2._M_allocated_capacity + 1
                         );
        }
        Json::Value::~Value((Value *)&installPrefix);
      }
      p_Var5 = &languages._M_t._M_impl.super__Rb_tree_header;
      languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      languages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
      languages._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      cmGeneratorTarget::GetLanguages(target,&languages,config);
      languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header;
      languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          p_Var5) {
        p_Var23 = languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          __k = p_Var23 + 1;
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                    ::operator[](&languageDataMap,(key_type *)__k);
          std::__cxx11::string::_M_assign((string *)&pmVar22->Language);
          cmLocalGenerator::GetTargetCompileFlags
                    (pcVar17,target,config,(string *)__k,&pmVar22->Flags);
          installPaths._8_8_ = installPaths._8_8_ & 0xffffffff00000000;
          installPaths.comments_ = (CommentInfo *)0x0;
          installPaths.start_ = (ptrdiff_t)&installPaths.field_0x8;
          local_5d8._M_p = (pointer)0x0;
          installPaths.limit_ = installPaths.start_;
          cmLocalGenerator::GetTargetDefines
                    (pcVar17,target,config,(string *)__k,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&installPaths);
          LanguageData::SetDefines
                    (pmVar22,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&installPaths);
          installPrefix._M_dataplus._M_p = (pointer)0x0;
          installPrefix._M_string_length = 0;
          installPrefix.field_2._M_allocated_capacity = 0;
          cmLocalGenerator::GetIncludeDirectories
                    (pcVar17,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&installPrefix,target,(string *)__k,config);
          sVar10 = installPrefix._M_string_length;
          if (installPrefix._M_dataplus._M_p != (pointer)installPrefix._M_string_length) {
            _Var30 = installPrefix._M_dataplus;
            do {
              bVar14 = cmGeneratorTarget::IsSystemIncludeDirectory
                                 (target,(string *)_Var30._M_p,config,(string *)__k);
              dest._M_dataplus._M_p._0_1_ = bVar14;
              std::
              vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
              ::emplace_back<std::__cxx11::string_const&,bool>
                        ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                          *)&pmVar22->IncludePathList,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var30._M_p,(bool *)&dest);
              _Var30._M_p = _Var30._M_p + 0x20;
            } while (_Var30._M_p != (pointer)sVar10);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&installPrefix);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&installPaths);
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        } while ((_Rb_tree_header *)p_Var23 != &languages._M_t._M_impl.super__Rb_tree_header);
      }
      files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&files,config);
      dest._M_dataplus._M_p = (pointer)&p_Stack_660;
      dest._M_string_length = 1;
      dest.field_2._M_allocated_capacity = 0;
      dest.field_2._8_8_ = 0;
      p_Stack_660 = (__node_base_ptr)0x0;
      local_440 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ppcVar24 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        do {
          this = *ppcVar24;
          installPaths.value_.uint_ = installPaths.value_.uint_ & 0xffffffffffffff00;
          installPaths._8_8_ = &installPaths.start_;
          installPaths.comments_ = (CommentInfo *)0x0;
          installPaths.start_ = installPaths.start_ & 0xffffffffffffff00;
          local_5d8._M_p = (pointer)&local_5c8;
          local_5d0 = (cmOutputConverter *)0x0;
          local_5c8._M_local_buf[0] = false;
          vStack_5a0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_5a0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_5b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_5a0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cmSourceFile::GetLanguage_abi_cxx11_(&installPrefix,this);
          std::__cxx11::string::operator=
                    ((string *)&installPaths.field_0x8,(string *)&installPrefix);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)installPrefix._M_dataplus._M_p != &installPrefix.field_2) {
            operator_delete(installPrefix._M_dataplus._M_p,
                            installPrefix.field_2._M_allocated_capacity + 1);
          }
          if (installPaths.comments_ != (CommentInfo *)0x0) {
            pmVar22 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::at(&languageDataMap,(key_type *)&installPaths.field_0x8);
            pcVar17 = cmGeneratorTarget::GetLocalGenerator(target);
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            pcVar7 = (config->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_378,pcVar7,pcVar7 + config->_M_string_length);
            local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_340,installPaths._8_8_,
                       (long)&(installPaths.comments_)->comment_ + installPaths._8_8_);
            cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                      ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar17,&local_378,target,
                       &local_340);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&targetGenerators.
                           super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pcVar7 = (pmVar22->Flags)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&targetGenerators,pcVar7,pcVar7 + (pmVar22->Flags)._M_string_length
                      );
            linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
            linkPath.field_2._8_5_ = 0x5347414c46;
            linkPath.field_2._M_local_buf[0] = 'C';
            linkPath.field_2._M_allocated_capacity._1_4_ = 0x49504d4f;
            linkPath.field_2._M_allocated_capacity._5_3_ = 0x5f454c;
            linkPath._M_string_length = 0xd;
            linkPath.field_2._M_local_buf[0xd] = '\0';
            pcVar18 = cmSourceFile::GetProperty(this,&linkPath);
            if (pcVar18 != (char *)0x0) {
              psVar19 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar18,
                                   &linkPath);
              (*pcVar17->_vptr_cmLocalGenerator[6])(pcVar17,&targetGenerators,psVar19);
            }
            COMPILE_OPTIONS._M_dataplus._M_p = (pointer)&COMPILE_OPTIONS.field_2;
            COMPILE_OPTIONS.field_2._8_7_ = 0x534e4f4954504f;
            COMPILE_OPTIONS.field_2._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
            COMPILE_OPTIONS.field_2._M_local_buf[7] = '_';
            COMPILE_OPTIONS._M_string_length = 0xf;
            COMPILE_OPTIONS.field_2._M_local_buf[0xf] = '\0';
            pcVar18 = cmSourceFile::GetProperty(this,&COMPILE_OPTIONS);
            if (pcVar18 != (char *)0x0) {
              psVar19 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar18,
                                   &COMPILE_OPTIONS);
              cmLocalGenerator::AppendCompileOptions
                        (pcVar17,(string *)&targetGenerators,(psVar19->_M_dataplus)._M_p,(char *)0x0
                        );
            }
            std::__cxx11::string::_M_assign((string *)&local_5d8);
            includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            includes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            INCLUDE_DIRECTORIES._M_dataplus._M_p = (pointer)&INCLUDE_DIRECTORIES.field_2;
            installPath._M_dataplus._M_p = (pointer)0x13;
            INCLUDE_DIRECTORIES._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&INCLUDE_DIRECTORIES,(ulong)&installPath);
            INCLUDE_DIRECTORIES.field_2._M_allocated_capacity =
                 (size_type)installPath._M_dataplus._M_p;
            builtin_strncpy(INCLUDE_DIRECTORIES._M_dataplus._M_p,"INCLUDE_DIRECTORIES",0x13);
            INCLUDE_DIRECTORIES._M_string_length = (size_type)installPath._M_dataplus._M_p;
            INCLUDE_DIRECTORIES._M_dataplus._M_p[(long)installPath._M_dataplus._M_p] = '\0';
            pcVar18 = cmSourceFile::GetProperty(this,&INCLUDE_DIRECTORIES);
            if (pcVar18 != (char *)0x0) {
              psVar19 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar18,
                                   &INCLUDE_DIRECTORIES);
              cmLocalGenerator::AppendIncludeDirectories
                        (pcVar17,&includes,(psVar19->_M_dataplus)._M_p,this);
              pbVar13 = includes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (dir = includes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; dir != pbVar13; dir = dir + 1) {
                bVar14 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (target,dir,config,(string *)&installPaths.field_0x8);
                installPath._M_dataplus._M_p._0_1_ = bVar14;
                std::
                vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                ::emplace_back<std::__cxx11::string_const&,bool>
                          ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                            *)&vStack_5a0,dir,(bool *)&installPath);
              }
            }
            std::
            vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,bool>const*,std::vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>>>
                      ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                        *)&vStack_5a0,
                       vStack_5a0.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (pmVar22->IncludePathList).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pmVar22->IncludePathList).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            COMPILE_DEFINITIONS._M_dataplus._M_p = (pointer)&COMPILE_DEFINITIONS.field_2;
            installPath._M_dataplus._M_p = (pointer)0x13;
            COMPILE_DEFINITIONS._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&COMPILE_DEFINITIONS,(ulong)&installPath);
            COMPILE_DEFINITIONS.field_2._M_allocated_capacity =
                 (size_type)installPath._M_dataplus._M_p;
            builtin_strncpy(COMPILE_DEFINITIONS._M_dataplus._M_p,"COMPILE_DEFINITIONS",0x13);
            COMPILE_DEFINITIONS._M_string_length = (size_type)installPath._M_dataplus._M_p;
            COMPILE_DEFINITIONS._M_dataplus._M_p[(long)installPath._M_dataplus._M_p] = '\0';
            installPath._M_string_length = installPath._M_string_length & 0xffffffff00000000;
            installPath.field_2._M_allocated_capacity = 0;
            installPath.field_2._8_8_ = &installPath._M_string_length;
            pcVar18 = cmSourceFile::GetProperty(this,&COMPILE_DEFINITIONS);
            if (pcVar18 != (char *)0x0) {
              psVar19 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar18,
                                   &COMPILE_DEFINITIONS);
              cmLocalGenerator::AppendDefines
                        (pcVar17,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&installPath,psVar19);
            }
            cmsys::SystemTools::UpperCase((string *)local_438,config);
            plVar25 = (long *)std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,0x519600)
            ;
            defPropName._M_dataplus._M_p = (pointer)&defPropName.field_2;
            psVar27 = (size_type *)(plVar25 + 2);
            if ((size_type *)*plVar25 == psVar27) {
              defPropName.field_2._M_allocated_capacity = *psVar27;
              defPropName.field_2._8_8_ = plVar25[3];
            }
            else {
              defPropName.field_2._M_allocated_capacity = *psVar27;
              defPropName._M_dataplus._M_p = (pointer)*plVar25;
            }
            defPropName._M_string_length = plVar25[1];
            *plVar25 = (long)psVar27;
            plVar25[1] = 0;
            *(undefined1 *)(plVar25 + 2) = 0;
            if (local_438[0] != &local_428) {
              operator_delete(local_438[0].string_,local_428._M_allocated_capacity + 1);
            }
            pcVar18 = cmSourceFile::GetProperty(this,&defPropName);
            if (pcVar18 != (char *)0x0) {
              psVar19 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar18,
                                   &COMPILE_DEFINITIONS);
              cmLocalGenerator::AppendDefines
                        (pcVar17,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&installPath,psVar19);
            }
            pbVar8 = (pmVar22->Defines).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_438[0].string_ = (char *)&installPath;
            for (__v = (pmVar22->Defines).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; __v != pbVar8; __v = __v + 1) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::
              _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&installPath,(const_iterator)&installPath._M_string_length,__v,
                         (_Alloc_node *)local_438);
            }
            LanguageData::SetDefines
                      ((LanguageData *)&installPaths,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&installPath);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)defPropName._M_dataplus._M_p != &defPropName.field_2) {
              operator_delete(defPropName._M_dataplus._M_p,
                              defPropName.field_2._M_allocated_capacity + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&installPath);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)COMPILE_DEFINITIONS._M_dataplus._M_p != &COMPILE_DEFINITIONS.field_2) {
              operator_delete(COMPILE_DEFINITIONS._M_dataplus._M_p,
                              COMPILE_DEFINITIONS.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)INCLUDE_DIRECTORIES._M_dataplus._M_p != &INCLUDE_DIRECTORIES.field_2) {
              operator_delete(INCLUDE_DIRECTORIES._M_dataplus._M_p,
                              INCLUDE_DIRECTORIES.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&includes);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)COMPILE_OPTIONS._M_dataplus._M_p != &COMPILE_OPTIONS.field_2) {
              operator_delete(COMPILE_OPTIONS._M_dataplus._M_p,
                              CONCAT17(COMPILE_OPTIONS.field_2._M_local_buf[7],
                                       COMPILE_OPTIONS.field_2._M_allocated_capacity._0_7_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
              operator_delete(linkPath._M_dataplus._M_p,
                              CONCAT35(linkPath.field_2._M_allocated_capacity._5_3_,
                                       CONCAT41(linkPath.field_2._M_allocated_capacity._1_4_,
                                                linkPath.field_2._M_local_buf[0])) + 1);
            }
            if (targetGenerators.
                super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&targetGenerators.
                          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(targetGenerators.
                              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              CONCAT71(targetGenerators.
                                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                       targetGenerators.
                                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._M_p != &local_450) {
              operator_delete(local_460._M_p,local_450._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_p != &local_478) {
              operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
            }
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&installPrefix.field_2._M_allocated_capacity);
            cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&installPrefix);
          }
          installPaths.value_.bool_ = this->IsGenerated;
          this_01 = std::__detail::
                    _Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&dest,(key_type *)&installPaths);
          psVar19 = cmSourceFile::GetFullPath(this,(string *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_01,psVar19);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::~vector(&vStack_5a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_p != &local_5c8) {
            operator_delete(local_5d8._M_p,
                            CONCAT71(local_5c8._M_allocated_capacity._1_7_,local_5c8._M_local_buf[0]
                                    ) + 1);
          }
          if ((ptrdiff_t *)installPaths._8_8_ != &installPaths.start_) {
            operator_delete((void *)installPaths._8_8_,installPaths.start_ + 1);
          }
          ppcVar24 = ppcVar24 + 1;
        } while (ppcVar24 != local_440);
      }
      psVar19 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(target->Makefile);
      Json::Value::Value(&sourceGroupsValue,arrayValue);
      if (dest.field_2._M_allocated_capacity != 0) {
        uVar31 = dest.field_2._M_allocated_capacity;
        do {
          Json::Value::Value((Value *)local_438,objectValue);
          if (*(long *)(uVar31 + 0x18) != 0) {
            Json::Value::Value(&installPaths,(string *)(uVar31 + 0x10));
            pVVar20 = Json::Value::operator[]((Value *)local_438,&kLANGUAGE_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar20,&installPaths);
            Json::Value::~Value(&installPaths);
            in = extraout_RDX;
            if (*(long *)(uVar31 + 0x38) != 0) {
              Json::Value::Value((Value *)&installPrefix,(string *)(uVar31 + 0x30));
              pVVar20 = Json::Value::operator[]((Value *)local_438,&kCOMPILE_FLAGS_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar20,(Value *)&installPrefix);
              Json::Value::~Value((Value *)&installPrefix);
              in = extraout_RDX_00;
            }
            if (*(long *)(uVar31 + 0x68) != *(long *)(uVar31 + 0x70)) {
              Json::Value::Value((Value *)&installPath,arrayValue);
              psVar9 = *(string **)(uVar31 + 0x70);
              for (psVar29 = *(string **)(uVar31 + 0x68); psVar29 != psVar9;
                  psVar29 = (string *)&psVar29[1]._M_string_length) {
                Json::Value::Value((Value *)&targetGenerators,objectValue);
                Json::Value::Value((Value *)&linkPath,psVar29);
                pVVar20 = Json::Value::operator[]((Value *)&targetGenerators,&kPATH_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar20,(Value *)&linkPath);
                Json::Value::~Value((Value *)&linkPath);
                if (*(char *)&psVar29[1]._M_dataplus._M_p == '\x01') {
                  Json::Value::Value((Value *)&COMPILE_OPTIONS,true);
                  pVVar20 = Json::Value::operator[]
                                      ((Value *)&targetGenerators,&kIS_SYSTEM_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar20,(Value *)&COMPILE_OPTIONS);
                  Json::Value::~Value((Value *)&COMPILE_OPTIONS);
                }
                Json::Value::append((Value *)&installPath,(Value *)&targetGenerators);
                Json::Value::~Value((Value *)&targetGenerators);
              }
              Json::Value::Value((Value *)&targetGenerators,(Value *)&installPath);
              pVVar20 = Json::Value::operator[]((Value *)local_438,&kINCLUDE_PATH_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar20,(Value *)&targetGenerators);
              Json::Value::~Value((Value *)&targetGenerators);
              Json::Value::~Value((Value *)&installPath);
              in = extraout_RDX_01;
            }
            if (*(long *)(uVar31 + 0x50) != *(long *)(uVar31 + 0x58)) {
              (anonymous_namespace)::
              fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((Value *)&installPath,(_anonymous_namespace_ *)(uVar31 + 0x50),in);
              pVVar20 = Json::Value::operator[]((Value *)local_438,&kDEFINES_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar20,(Value *)&installPath);
              Json::Value::~Value((Value *)&installPath);
            }
          }
          Json::Value::Value((Value *)&INCLUDE_DIRECTORIES,SUB81(*(long *)(uVar31 + 8),0));
          pVVar20 = Json::Value::operator[]((Value *)local_438,&kIS_GENERATED_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,(Value *)&INCLUDE_DIRECTORIES);
          Json::Value::~Value((Value *)&INCLUDE_DIRECTORIES);
          Json::Value::Value((Value *)&COMPILE_DEFINITIONS,arrayValue);
          psVar9 = *(string **)(uVar31 + 0x88);
          for (psVar29 = *(string **)(uVar31 + 0x80); psVar29 != psVar9; psVar29 = psVar29 + 1) {
            cmSystemTools::RelativePath((string *)&includes,psVar19,psVar29);
            value = (string *)&includes;
            if ((pointer)psVar29->_M_string_length <=
                includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              value = psVar29;
            }
            Json::Value::Value((Value *)&defPropName,value);
            Json::Value::append((Value *)&COMPILE_DEFINITIONS,(Value *)&defPropName);
            Json::Value::~Value((Value *)&defPropName);
            if (includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(includes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&((includes.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + 1));
            }
          }
          Json::Value::Value((Value *)&defPropName,(Value *)&COMPILE_DEFINITIONS);
          pVVar20 = Json::Value::operator[]((Value *)local_438,&kSOURCES_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar20,(Value *)&defPropName);
          Json::Value::~Value((Value *)&defPropName);
          Json::Value::~Value((Value *)&COMPILE_DEFINITIONS);
          bVar14 = Json::Value::isNull((Value *)local_438);
          if (!bVar14) {
            Json::Value::append(&sourceGroupsValue,(Value *)local_438);
          }
          Json::Value::~Value((Value *)local_438);
          uVar31 = *(undefined8 *)uVar31;
        } while (uVar31 != 0);
      }
      std::
      _Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&dest);
      if (files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)files.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)files.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar14 = Json::Value::empty(&sourceGroupsValue);
      if (!bVar14) {
        Json::Value::Value(&local_2d8,&sourceGroupsValue);
        pVVar20 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar20,&local_2d8);
        Json::Value::~Value(&local_2d8);
      }
      Json::Value::~Value(&sourceGroupsValue);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
      ::~_Rb_tree(&languageDataMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&languages._M_t);
    }
  }
  Json::Value::~Value(&ttl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeName._M_dataplus._M_p != &typeName.field_2) {
    operator_delete(typeName._M_dataplus._M_p,typeName.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = cmState::GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kIS_GENERATOR_PROVIDED_KEY] =
    target->Target->GetIsGeneratorProvided();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  if (target->Target->GetHaveInstallRule()) {
    result[kHAS_INSTALL_RULE] = true;

    Json::Value installPaths = Json::arrayValue;
    auto targetGenerators = target->Makefile->GetInstallGenerators();
    for (auto installGenerator : targetGenerators) {
      auto installTargetGenerator =
        dynamic_cast<cmInstallTargetGenerator*>(installGenerator);
      if (installTargetGenerator != nullptr &&
          installTargetGenerator->GetTarget()->Target == target->Target) {
        auto dest = installTargetGenerator->GetDestination(config);

        std::string installPath;
        if (!dest.empty() && cmSystemTools::FileIsFullPath(dest)) {
          installPath = dest;
        } else {
          std::string installPrefix =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
          installPath = installPrefix + '/' + dest;
        }

        installPaths.append(installPath);
      }
    }

    result[kINSTALL_PATHS] = installPaths;
  }

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;

  for (std::string const& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config);
    for (std::string const& i : includePathList) {
      ld.IncludePathList.emplace_back(
        i, target->IsSystemIncludeDirectory(i, config, lang));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}